

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

void __thiscall QUtcTimeZonePrivate::~QUtcTimeZonePrivate(QUtcTimeZonePrivate *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_comment).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_abbreviation).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_name).d);
  QTimeZonePrivate::~QTimeZonePrivate(&this->super_QTimeZonePrivate);
  return;
}

Assistant:

QUtcTimeZonePrivate::~QUtcTimeZonePrivate()
{
}